

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall
ThreadContext::RegisterProtoInlineCache
          (ThreadContext *this,InlineCache *inlineCache,PropertyId propertyId)

{
  bool bVar1;
  PropertyRecord *this_00;
  char16 *pcVar2;
  PropertyId propertyId_local;
  InlineCache *inlineCache_local;
  ThreadContext *this_local;
  
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,TraceInlineCacheInvalidationPhase);
  if (bVar1) {
    this_00 = GetPropertyName(this,propertyId);
    pcVar2 = Js::PropertyRecord::GetBuffer(this_00);
    Output::Print(L"InlineCacheInvalidation: registering proto cache 0x%p for property %s(%u)\n",
                  inlineCache,pcVar2,(ulong)(uint)propertyId);
    Output::Flush();
  }
  RegisterInlineCache(this,&this->protoInlineCacheByPropId,inlineCache,propertyId);
  return;
}

Assistant:

void
ThreadContext::RegisterProtoInlineCache(Js::InlineCache * inlineCache, Js::PropertyId propertyId)
{
    if (PHASE_TRACE1(Js::TraceInlineCacheInvalidationPhase))
    {
        Output::Print(_u("InlineCacheInvalidation: registering proto cache 0x%p for property %s(%u)\n"),
            inlineCache, GetPropertyName(propertyId)->GetBuffer(), propertyId);
        Output::Flush();
    }

    RegisterInlineCache(protoInlineCacheByPropId, inlineCache, propertyId);
}